

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

Vec_Int_t * Saig_ManFindIsoPerm(Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Iso_Man_t *p_00;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  bool bVar8;
  abctime clk2;
  abctime clk;
  Iso_Man_t *p;
  Vec_Int_t *vRes;
  int fVeryVerbose;
  int fVerbose_local;
  Aig_Man_t *pAig_local;
  
  aVar4 = Abc_Clock();
  aVar5 = Abc_Clock();
  p_00 = Iso_ManCreate(pAig);
  aVar6 = Abc_Clock();
  p_00->timeFout = (aVar6 - aVar4) + p_00->timeFout;
  Iso_ManPrintClasses(p_00,fVerbose,0);
  while (p_00->nClasses != 0) {
    aVar4 = Abc_Clock();
    Iso_ManAssignAdjacency(p_00);
    aVar6 = Abc_Clock();
    p_00->timeFout = (aVar6 - aVar4) + p_00->timeFout;
    aVar4 = Abc_Clock();
    Iso_ManRehashClassNodes(p_00);
    aVar6 = Abc_Clock();
    p_00->timeHash = (aVar6 - aVar4) + p_00->timeHash;
    Iso_ManPrintClasses(p_00,fVerbose,0);
    while( true ) {
      bVar8 = false;
      if (p_00->nSingles == 0) {
        bVar8 = p_00->nClasses != 0;
      }
      if (!bVar8) break;
      Iso_ManBreakTies(p_00,fVerbose);
      aVar4 = Abc_Clock();
      Iso_ManAssignAdjacency(p_00);
      aVar6 = Abc_Clock();
      p_00->timeFout = (aVar6 - aVar4) + p_00->timeFout;
      aVar4 = Abc_Clock();
      Iso_ManRehashClassNodes(p_00);
      aVar6 = Abc_Clock();
      p_00->timeHash = (aVar6 - aVar4) + p_00->timeHash;
      Iso_ManPrintClasses(p_00,fVerbose,0);
    }
  }
  aVar4 = Abc_Clock();
  p_00->timeTotal = aVar4 - aVar5;
  iVar1 = p_00->nObjIds;
  iVar2 = Aig_ManCiNum(p_00->pAig);
  iVar3 = Aig_ManNodeNum(p_00->pAig);
  if (iVar1 != iVar2 + 1 + iVar3) {
    __assert_fail("p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigIsoSlow.c"
                  ,0x4b9,"Vec_Int_t *Saig_ManFindIsoPerm(Aig_Man_t *, int)");
  }
  pVVar7 = Iso_ManFinalize(p_00);
  Iso_ManStop(p_00,fVerbose);
  return pVVar7;
}

Assistant:

Vec_Int_t * Saig_ManFindIsoPerm( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Int_t * vRes;
    Iso_Man_t * p;
    abctime clk = Abc_Clock(), clk2 = Abc_Clock();
    p = Iso_ManCreate( pAig );
    p->timeFout += Abc_Clock() - clk;
    Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
    while ( p->nClasses )
    {
        // assign adjacency to classes
        clk = Abc_Clock();
        Iso_ManAssignAdjacency( p );
        p->timeFout += Abc_Clock() - clk;
        // rehash the class nodes
        clk = Abc_Clock();
        Iso_ManRehashClassNodes( p );
        p->timeHash += Abc_Clock() - clk;
        Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        // force refinement
        while ( p->nSingles == 0 && p->nClasses )
        {
//            Iso_ManPrintClasseSizes( p );
            // assign IDs to the topmost level of classes
            Iso_ManBreakTies( p, fVerbose );
            // assign adjacency to classes
            clk = Abc_Clock();
            Iso_ManAssignAdjacency( p );
            p->timeFout += Abc_Clock() - clk;
            // rehash the class nodes
            clk = Abc_Clock();
            Iso_ManRehashClassNodes( p );
            p->timeHash += Abc_Clock() - clk;
            Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        }
    }
    p->timeTotal = Abc_Clock() - clk2;
//    printf( "IDs assigned = %d.  Objects = %d.\n", p->nObjIds, 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
    assert( p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
//    if ( p->nClasses )
//        Iso_ManDumpOneClass( p );
    vRes = Iso_ManFinalize( p );
    Iso_ManStop( p, fVerbose );
    return vRes;
}